

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O3

double __thiscall
units::detail::extraValidConversions<units::precise_unit,units::unit>
          (detail *this,double val,precise_unit *start,unit *result)

{
  uint extraout_EAX;
  uint extraout_EAX_00;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  double dVar2;
  
  fVar1 = power_const<float>(1.0,3);
  unit_data::pow((unit_data *)((long)&m + 4),(double)CONCAT44(extraout_XMM0_Db,fVar1),in_XMM1_Qa);
  if ((((extraout_EAX ^ *(uint *)(this + 8)) & 0xfffffff) == 0) &&
     (((ulong)start->multiplier_ & 0xfffffff00000000) == 0x1e200000000)) {
    dVar2 = val * *(double *)this * 40984840.36367558;
  }
  else {
    if ((*(uint *)(this + 8) & 0xfffffff) != 0x1e2) {
      return NAN;
    }
    fVar1 = power_const<float>(1.0,3);
    unit_data::pow((unit_data *)((long)&m + 4),(double)CONCAT44(extraout_XMM0_Db_00,fVar1),
                   in_XMM1_Qa);
    if (((extraout_EAX_00 ^ *(uint *)((long)&start->multiplier_ + 4)) & 0xfffffff) != 0) {
      return NAN;
    }
    dVar2 = (val * *(double *)this) / 40984840.36367558;
  }
  return dVar2 / (double)*(float *)&start->multiplier_;
}

Assistant:

inline double
        extraValidConversions(double val, const UX& start, const UX2& result)
    {
        if (start.has_same_base(m.pow(3)) && result.has_same_base(J)) {
            // volume to scf or scm
            return val * start.multiplier() *
                precise::energy::scm.multiplier() / result.multiplier();
        }
        if (start.has_same_base(J) && result.has_same_base(m.pow(3))) {
            // volume to scf or scm
            return val * start.multiplier() /
                precise::energy::scm.multiplier() / result.multiplier();
        }
        return constants::invalid_conversion;
    }